

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O0

void add_generator<trng::mrg5>
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>_>_>_>
                *func_map)

{
  char *pcVar1;
  mrg5 r;
  parameter_type *in_stack_ffffffffffffff68;
  mrg5 *in_stack_ffffffffffffff70;
  allocator *__f;
  function<void_(unsigned_long,_unsigned_long)> *in_stack_ffffffffffffff90;
  allocator local_59;
  key_type *in_stack_ffffffffffffffa8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>_>_>_>
  *in_stack_ffffffffffffffb0;
  
  trng::mrg5::mrg5(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pcVar1 = trng::mrg5::name();
  __f = &local_59;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffa8,pcVar1,__f);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(unsigned_long,_unsigned_long)>_>_>_>
  ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::function<void(unsigned_long,unsigned_long)>::operator=
            (in_stack_ffffffffffffff90,(anon_class_1_0_00000001 *)__f);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return;
}

Assistant:

void add_generator(
    std::map<std::string, std::function<void(std::size_t, unsigned long)>> &func_map) {
  const R r;
  func_map[r.name()] = [&](std::size_t samples, unsigned long seed) {
    generate<R>(samples, seed);
  };
}